

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

bool __thiscall QPushButton::hitButton(QPushButton *this,QPoint *pos)

{
  long lVar1;
  undefined1 uVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_a8 [16];
  QStyleOptionButton option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  option.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  option.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  option.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  option.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  option._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton(&option);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&option);
  pQVar3 = QWidget::style((QWidget *)this);
  local_a8 = (**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x38,&option,this);
  uVar2 = QRect::contains((QPoint *)local_a8,SUB81(pos,0));
  QStyleOptionButton::~QStyleOptionButton(&option);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QPushButton::hitButton(const QPoint &pos) const
{
    QStyleOptionButton option;
    initStyleOption(&option);
    const QRect bevel = style()->subElementRect(QStyle::SE_PushButtonBevel, &option, this);
    return bevel.contains(pos);
}